

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotp.c
# Opt level: O2

char * mtotp_hotp_l(char *secret,size_t secret_len,uint64_t counter,int length,char *buf)

{
  uint uVar1;
  ulong uVar2;
  char *__assertion;
  int iVar3;
  bool bVar4;
  uint8_t hmac [20];
  ulong local_20;
  
  if (secret_len == 0) {
    __assertion = "secret_len > 0";
    uVar1 = 0x22;
  }
  else {
    if (5 < length) {
      local_20 = counter >> 0x38 | (counter & 0xff000000000000) >> 0x28 |
                 (counter & 0xff0000000000) >> 0x18 | (counter & 0xff00000000) >> 8 |
                 (counter & 0xff000000) << 8 | (counter & 0xff0000) << 0x18 |
                 (counter & 0xff00) << 0x28 | counter << 0x38;
      hmac_sha1((uint8_t *)secret,secret_len,(uint8_t *)&local_20,8,hmac);
      uVar2 = (ulong)(hmac[0x13] & 0xf);
      uVar1 = 1;
      iVar3 = length;
      while( true ) {
        bVar4 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar4) break;
        uVar1 = uVar1 * 10;
      }
      pad_otp(((uint)hmac[uVar2 + 2] << 8 |
               (uint)hmac[uVar2 + 1] << 0x10 | (hmac[uVar2] & 0x7f) << 0x18 | (uint)hmac[uVar2 + 3])
              % uVar1,length,buf);
      return buf;
    }
    __assertion = "length >= 6";
    uVar1 = 0x23;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                ,uVar1,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
}

Assistant:

char *mtotp_hotp_l(const char *secret, size_t secret_len, uint64_t counter,
                   int length, char *buf) {
  assert(secret_len > 0);
  assert(length >= 6);

  counter = htobe64(counter);
  uint8_t hmac[20];
  hmac_sha1((const uint8_t *)secret, secret_len, (const uint8_t *)&counter,
            sizeof(counter), hmac);

  uint32_t code = mod(dynamic_truncate(hmac), length);

  pad_otp(code, length, buf);

  return buf;
}